

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

int mpc_nodecount_unretained(mpc_parser_t *p,int force)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  mpc_parser_t *p_00;
  long lVar5;
  int iVar6;
  long lVar7;
  
  iVar4 = 0;
  iVar6 = 0;
LAB_0010907b:
  if ((force == 0) && (p->retained != '\0')) {
    iVar3 = 0;
    goto LAB_00109148;
  }
  iVar3 = 0;
  while (p->type == '\x05') {
    p = (p->data).expect.x;
    iVar3 = iVar3 + 1;
    if (p->retained != '\0') {
      iVar4 = 0;
      goto LAB_00109148;
    }
  }
  switch(p->type) {
  case '\x0f':
    goto switchD_001090b8_caseD_f;
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x19':
  case '\x1a':
    p_00 = (p->data).expect.x;
LAB_001090d2:
    iVar4 = mpc_nodecount_unretained(p_00,0);
    return iVar3 + iVar6 + iVar4 + 1;
  case '\x14':
  case '\x15':
  case '\x16':
    p_00 = (p->data).repeat.x;
    goto LAB_001090d2;
  case '\x17':
    lVar7 = (long)(p->data).repeat.n;
    if (0 < lVar7) {
      pvVar1 = (p->data).lift.x;
      iVar4 = 1;
      lVar5 = 0;
      do {
        iVar2 = mpc_nodecount_unretained(*(mpc_parser_t **)((long)pvVar1 + lVar5 * 8),0);
        iVar4 = iVar4 + iVar2;
        lVar5 = lVar5 + 1;
      } while (lVar7 != lVar5);
LAB_00109148:
      return iVar3 + iVar6 + iVar4;
    }
    break;
  case '\x18':
    lVar7 = (long)(p->data).repeat.n;
    if (0 < lVar7) {
      pvVar1 = (p->data).apply_to.d;
      iVar4 = 1;
      lVar5 = 0;
      do {
        iVar2 = mpc_nodecount_unretained(*(mpc_parser_t **)((long)pvVar1 + lVar5 * 8),0);
        iVar4 = iVar4 + iVar2;
        lVar5 = lVar5 + 1;
      } while (lVar7 != lVar5);
      goto LAB_00109148;
    }
  }
  iVar4 = 1;
  goto LAB_00109148;
switchD_001090b8_caseD_f:
  p = (p->data).expect.x;
  iVar6 = iVar6 + iVar3 + 1;
  force = 0;
  goto LAB_0010907b;
}

Assistant:

static int mpc_nodecount_unretained(mpc_parser_t* p, int force) {

  int i, total;

  if (p->retained && !force) { return 0; }

  if (p->type == MPC_TYPE_EXPECT) { return 1 + mpc_nodecount_unretained(p->data.expect.x, 0); }

  if (p->type == MPC_TYPE_APPLY)    { return 1 + mpc_nodecount_unretained(p->data.apply.x, 0); }
  if (p->type == MPC_TYPE_APPLY_TO) { return 1 + mpc_nodecount_unretained(p->data.apply_to.x, 0); }
  if (p->type == MPC_TYPE_PREDICT)  { return 1 + mpc_nodecount_unretained(p->data.predict.x, 0); }

  if (p->type == MPC_TYPE_CHECK)    { return 1 + mpc_nodecount_unretained(p->data.check.x, 0); }
  if (p->type == MPC_TYPE_CHECK_WITH) { return 1 + mpc_nodecount_unretained(p->data.check_with.x, 0); }

  if (p->type == MPC_TYPE_NOT)   { return 1 + mpc_nodecount_unretained(p->data.not.x, 0); }
  if (p->type == MPC_TYPE_MAYBE) { return 1 + mpc_nodecount_unretained(p->data.not.x, 0); }

  if (p->type == MPC_TYPE_MANY)  { return 1 + mpc_nodecount_unretained(p->data.repeat.x, 0); }
  if (p->type == MPC_TYPE_MANY1) { return 1 + mpc_nodecount_unretained(p->data.repeat.x, 0); }
  if (p->type == MPC_TYPE_COUNT) { return 1 + mpc_nodecount_unretained(p->data.repeat.x, 0); }

  if (p->type == MPC_TYPE_OR) {
    total = 1;
    for(i = 0; i < p->data.or.n; i++) {
      total += mpc_nodecount_unretained(p->data.or.xs[i], 0);
    }
    return total;
  }

  if (p->type == MPC_TYPE_AND) {
    total = 1;
    for(i = 0; i < p->data.and.n; i++) {
      total += mpc_nodecount_unretained(p->data.and.xs[i], 0);
    }
    return total;
  }

  return 1;

}